

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui.cpp
# Opt level: O2

void ImGui::UpdateMouseMovingWindowEndFrame(void)

{
  ImGuiWindow *pIVar1;
  ImGuiWindow *this;
  ImGuiContext *pIVar2;
  bool bVar3;
  ImGuiWindow *pIVar4;
  ulong uVar5;
  ImRect local_20;
  
  pIVar2 = GImGui;
  if (((GImGui->ActiveId == 0) && (GImGui->HoveredId == 0)) &&
     ((pIVar4 = GImGui->NavWindow, pIVar4 == (ImGuiWindow *)0x0 || (pIVar4->Appearing == false)))) {
    if ((GImGui->IO).MouseClicked[0] == true) {
      pIVar1 = GImGui->HoveredWindow;
      if ((pIVar1 == (ImGuiWindow *)0x0) ||
         (this = pIVar1->RootWindowDockStop, this == (ImGuiWindow *)0x0)) {
        if (pIVar4 != (ImGuiWindow *)0x0) {
          pIVar4 = GetTopMostPopupModal();
          if (pIVar4 == (ImGuiWindow *)0x0) {
            FocusWindow((ImGuiWindow *)0x0);
          }
        }
      }
      else {
        StartMouseMovingWindow(pIVar1);
        if (((pIVar2->IO).ConfigWindowsMoveFromTitleBarOnly == true) &&
           (((this->Flags & 1) == 0 || ((this->field_0x43a & 1) != 0)))) {
          local_20 = ImGuiWindow::TitleBarRect(this);
          bVar3 = ImRect::Contains(&local_20,(pIVar2->IO).MouseClickedPos);
          if (!bVar3) {
            pIVar2->MovingWindow = (ImGuiWindow *)0x0;
          }
        }
      }
    }
    if ((pIVar2->IO).MouseClicked[1] == true) {
      pIVar4 = GetTopMostPopupModal();
      bVar3 = pIVar4 == (ImGuiWindow *)0x0;
      for (uVar5 = (ulong)(uint)(pIVar2->Windows).Size;
          ((0 < (int)uVar5 && (!bVar3)) &&
          (pIVar1 = (pIVar2->Windows).Data[uVar5 - 1], pIVar1 != pIVar4)); uVar5 = uVar5 - 1) {
        if (pIVar1 == pIVar2->HoveredWindow) {
          bVar3 = true;
        }
      }
      if (bVar3) {
        pIVar4 = pIVar2->HoveredWindow;
      }
      ClosePopupsOverWindow(pIVar4,true);
    }
  }
  return;
}

Assistant:

void ImGui::UpdateMouseMovingWindowEndFrame()
{
    ImGuiContext& g = *GImGui;
    if (g.ActiveId != 0 || g.HoveredId != 0)
        return;

    // Unless we just made a window/popup appear
    if (g.NavWindow && g.NavWindow->Appearing)
        return;

    // Click on void to focus window and start moving
    // (after we're done with all our widgets, so e.g. clicking on docking tab-bar which have set HoveredId already and not get us here!)
    if (g.IO.MouseClicked[0])
    {
        ImGuiWindow* root_window = g.HoveredWindow ? g.HoveredWindow->RootWindowDockStop : NULL;
        if (root_window != NULL)
        {
            StartMouseMovingWindow(g.HoveredWindow);
            if (g.IO.ConfigWindowsMoveFromTitleBarOnly)
                if (!(root_window->Flags & ImGuiWindowFlags_NoTitleBar) || root_window->DockIsActive)
                    if (!root_window->TitleBarRect().Contains(g.IO.MouseClickedPos[0]))
                        g.MovingWindow = NULL;
        }
        else if (g.NavWindow != NULL && GetTopMostPopupModal() == NULL)
        {
            // Clicking on void disable focus
            FocusWindow(NULL);
        }
    }

    // With right mouse button we close popups without changing focus based on where the mouse is aimed
    // Instead, focus will be restored to the window under the bottom-most closed popup.
    // (The left mouse button path calls FocusWindow on the hovered window, which will lead NewFrame->ClosePopupsOverWindow to trigger)
    if (g.IO.MouseClicked[1])
    {
        // Find the top-most window between HoveredWindow and the top-most Modal Window.
        // This is where we can trim the popup stack.
        ImGuiWindow* modal = GetTopMostPopupModal();
        bool hovered_window_above_modal = false;
        if (modal == NULL)
            hovered_window_above_modal = true;
        for (int i = g.Windows.Size - 1; i >= 0 && hovered_window_above_modal == false; i--)
        {
            ImGuiWindow* window = g.Windows[i];
            if (window == modal)
                break;
            if (window == g.HoveredWindow)
                hovered_window_above_modal = true;
        }
        ClosePopupsOverWindow(hovered_window_above_modal ? g.HoveredWindow : modal, true);
    }
}